

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBatchTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestBatchTestHandler::WriteSrunArgs(cmCTestBatchTestHandler *this,int test,ostream *fout)

{
  mapped_type pcVar1;
  mapped_type *ppcVar2;
  ostream *poVar3;
  cmCTestTestProperties *properties;
  ostream *fout_local;
  cmCTestBatchTestHandler *pcStack_10;
  int test_local;
  cmCTestBatchTestHandler *this_local;
  
  fout_local._4_4_ = test;
  pcStack_10 = this;
  ppcVar2 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->super_cmCTestMultiProcessHandler).Properties.
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)((long)&fout_local + 4));
  pcVar1 = *ppcVar2;
  std::operator<<(fout,"srun ");
  poVar3 = std::operator<<(fout,"-J=");
  poVar3 = std::operator<<(poVar3,(string *)pcVar1);
  std::operator<<(poVar3," ");
  if ((pcVar1->RunSerial & 1U) != 0) {
    std::operator<<(fout,"--exclusive ");
  }
  if (1 < pcVar1->Processors) {
    poVar3 = std::operator<<(fout,"-n");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pcVar1->Processors);
    std::operator<<(poVar3," ");
  }
  return;
}

Assistant:

void cmCTestBatchTestHandler::WriteSrunArgs(int test, std::ostream& fout)
{
  cmCTestTestHandler::cmCTestTestProperties* properties =
    this->Properties[test];

  fout << "srun ";
  // fout << "--jobid=" << test << " ";
  fout << "-J=" << properties->Name << " ";

  // Write dependency information
  /*if(!this->Tests[test].empty())
    {
      fout << "-P=afterany";
      for(TestSet::iterator i = this->Tests[test].begin();
          i != this->Tests[test].end(); ++i)
        {
          fout << ":" << *i;
        }
      fout << " ";
    }*/
  if (properties->RunSerial) {
    fout << "--exclusive ";
  }
  if (properties->Processors > 1) {
    fout << "-n" << properties->Processors << " ";
  }
}